

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingDecomposerLib.c
# Opt level: O3

uint * RDL_giveRCF(RDL_data *data,uint index,char mode)

{
  uint bcc_index;
  RDL_graph *pRVar1;
  uint uVar2;
  char *edges;
  void *__ptr;
  uint *puVar3;
  RDL_node *pRVar4;
  ulong uVar5;
  int iVar6;
  undefined7 in_register_00000011;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  
  iVar6 = (int)CONCAT71(in_register_00000011,mode);
  if (iVar6 == 0x62) {
    uVar2 = data->rcf_to_urf[index][0];
    uVar8 = data->rcf_to_urf[index][1];
    bcc_index = data->urf_to_bcc[uVar2][0];
    uVar2 = data->urf_to_bcc[uVar2][1];
    pRVar1 = data->bccGraphs->bcc_graphs[bcc_index];
    edges = (char *)calloc(1,(ulong)pRVar1->E);
    __ptr = malloc(0x100);
    RDL_getEdges_internal(data,bcc_index,uVar2,uVar8,edges);
    uVar2 = pRVar1->E;
    if (uVar2 == 0) {
      uVar8 = 0;
    }
    else {
      uVar7 = 0x40;
      uVar9 = 0;
      uVar8 = 0;
      do {
        if (edges[uVar9] == '\x01') {
          if (uVar8 == (uint)uVar7) {
            uVar7 = (ulong)(uVar8 * 2);
            __ptr = realloc(__ptr,uVar7 * 4);
          }
          uVar5 = (ulong)uVar8;
          uVar8 = uVar8 + 1;
          *(uint *)((long)__ptr + uVar5 * 4) =
               data->bccGraphs->edge_from_bcc_mapping[bcc_index][uVar9];
          uVar2 = pRVar1->E;
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 < uVar2);
    }
    puVar3 = (uint *)realloc(__ptr,(ulong)(uVar8 + 1) << 2);
    puVar3[uVar8] = 0xffffffff;
    free(edges);
    return puVar3;
  }
  if (iVar6 != 0x61) {
    (*RDL_outputFunc)(RDL_ERROR,"tried to call \'RDL_giveRCF()\' with invalid mode \'%c\'\n",
                      (ulong)(uint)(int)mode);
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rareylab[P]RingDecomposerLib/src/RingDecomposerLib/RingDecomposerLib.c"
                  ,0x2c9,"unsigned int *RDL_giveRCF(const RDL_data *, unsigned int, char)");
  }
  pRVar4 = RDL_getNodesRCF(data,index);
  return pRVar4;
}

Assistant:

static unsigned *RDL_giveRCF(const RDL_data *data, unsigned index, char mode)
{
  unsigned *result;
  if(mode == 'a')
  {
    result = RDL_getNodesRCF(data, index);
  }
  else if(mode == 'b')
  {
    result = RDL_getEdgesRCF(data, index);
  }
  else
  {
    RDL_outputFunc(RDL_ERROR, "tried to call 'RDL_giveRCF()' with invalid mode '%c'\n", mode);
    /* cannot occur when using interface */
    assert(0);
    return NULL;
  }

  return result;
}